

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

size_t secp256k1_pippenger_bucket_window_inv(int bucket_window)

{
  int bucket_window_local;
  size_t local_8;
  
  switch(bucket_window) {
  case 1:
    local_8 = 1;
    break;
  case 2:
    local_8 = 4;
    break;
  case 3:
    local_8 = 0x14;
    break;
  case 4:
    local_8 = 0x39;
    break;
  case 5:
    local_8 = 0x88;
    break;
  case 6:
    local_8 = 0xeb;
    break;
  case 7:
    local_8 = 0x4ec;
    break;
  case 8:
    local_8 = 0x4ec;
    break;
  case 9:
    local_8 = 0x1144;
    break;
  case 10:
    local_8 = 0x1ec8;
    break;
  case 0xb:
    local_8 = 0x3eb2;
    break;
  case 0xc:
    local_8 = 0xffffffffffffffff;
    break;
  default:
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t secp256k1_pippenger_bucket_window_inv(int bucket_window) {
    switch(bucket_window) {
        case 1: return 1;
        case 2: return 4;
        case 3: return 20;
        case 4: return 57;
        case 5: return 136;
        case 6: return 235;
        case 7: return 1260;
        case 8: return 1260;
        case 9: return 4420;
        case 10: return 7880;
        case 11: return 16050;
        case PIPPENGER_MAX_BUCKET_WINDOW: return SIZE_MAX;
    }
    return 0;
}